

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O3

SharedPtr<Decorator> __thiscall
Rml::DecoratorLinearGradientInstancer::InstanceDecorator
          (DecoratorLinearGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  DecoratorLinearGradientInstancer *pDVar1;
  DecoratorLinearGradient *pDVar2;
  Property *this_00;
  Property *this_01;
  Property *pPVar3;
  Property *pPVar4;
  Property *pPVar5;
  NumericValue value;
  undefined4 uVar6;
  int iVar7;
  DecoratorInstancerInterface *pDVar8;
  undefined8 extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  uint uVar10;
  Corner CVar11;
  float fVar12;
  undefined1 auVar13 [16];
  SharedPtr<Decorator> SVar14;
  undefined1 local_69;
  DecoratorLinearGradient *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  Property *local_50;
  DecoratorLinearGradientInstancer *local_48;
  PropertyDictionary *local_40;
  Property *local_38;
  
  pDVar8 = param_3;
  local_48 = this;
  local_40 = properties_;
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  uVar6 = SUB84(pDVar8,0);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  pPVar5 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xc]);
  pDVar1 = local_48;
  _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71((int7)((ulong)extraout_RDX >> 8),pPVar5 != (Property *)0x0);
  auVar13._0_4_ = -(uint)((int)((ulong)this_00 >> 0x20) == 0 && (int)this_00 == 0);
  auVar13._4_4_ = -(uint)((int)this_01 == 0 && (int)((ulong)this_01 >> 0x20) == 0);
  auVar13._8_4_ = -(uint)((int)((ulong)pPVar3 >> 0x20) == 0 && (int)pPVar3 == 0);
  auVar13._12_4_ = -(uint)((int)pPVar4 == 0 && (int)((ulong)pPVar4 >> 0x20) == 0);
  iVar7 = movmskps(uVar6,auVar13);
  if (iVar7 != 0 || pPVar5 == (Property *)0x0) {
    (pDVar1->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (pDVar1->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_00208ef7;
  }
  local_68 = (DecoratorLinearGradient *)((ulong)local_68 & 0xffffffffffffff00);
  local_50 = pPVar4;
  local_38 = pPVar3;
  Variant::GetInto<bool,_0>(&this_01->value,(bool *)&local_68);
  if ((char)local_68 == '\x01') {
    local_68 = (DecoratorLinearGradient *)((ulong)local_68 & 0xffffffff00000000);
    Variant::GetInto<int,_0>(&local_38->value,(int *)&local_68);
    uVar10 = (uint)local_68;
    local_68 = (DecoratorLinearGradient *)((ulong)local_68 & 0xffffffff00000000);
    Variant::GetInto<int,_0>(&local_50->value,(int *)&local_68);
    uVar10 = (uVar10 | (uint)local_68) - 1;
    _Var9._M_pi = extraout_RDX_00;
    if ((uVar10 < 0xc) && ((0x9afU >> (uVar10 & 0x1f) & 1) != 0)) {
      fVar12 = *(float *)(&DAT_002d1d7c + (ulong)uVar10 * 4);
      CVar11 = *(Corner *)(&DAT_002d1dac + (ulong)uVar10 * 4);
      goto LAB_00208e65;
    }
  }
  else {
    value = Property::GetNumericValue(this_00);
    fVar12 = ComputeAngle(value);
    CVar11 = Count;
    _Var9._M_pi = extraout_RDX_01;
LAB_00208e65:
    if (pPVar5->unit == COLORSTOPLIST) {
      local_50 = (Property *)CONCAT44(local_50._4_4_,fVar12);
      iVar7 = ::std::__cxx11::string::compare((char *)local_40);
      local_68 = (DecoratorLinearGradient *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Rml::DecoratorLinearGradient,std::allocator<Rml::DecoratorLinearGradient>>
                (a_Stack_60,&local_68,(allocator<Rml::DecoratorLinearGradient> *)&local_69);
      pDVar2 = local_68;
      local_68->repeating = iVar7 == 0;
      local_68->corner = CVar11;
      local_68->angle = local_50._0_4_;
      ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
                (&local_68->color_stops,
                 (vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)(pPVar5->value).data);
      _Var9._M_pi = extraout_RDX_02;
      if ((pDVar2->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (pDVar2->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        (pDVar1->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
        (pDVar1->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
          _Var9._M_pi = extraout_RDX_03;
        }
      }
      else {
        (pDVar1->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)local_68;
        (pDVar1->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)a_Stack_60[0]._M_pi;
      }
      goto LAB_00208ef7;
    }
  }
  (pDVar1->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
  (pDVar1->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00208ef7:
  SVar14.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  SVar14.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pDVar1;
  return (SharedPtr<Decorator>)SVar14.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SharedPtr<Decorator> DecoratorLinearGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_angle = properties_.GetProperty(ids.angle);
	const Property* p_direction_to = properties_.GetProperty(ids.direction_to);
	const Property* p_direction_x = properties_.GetProperty(ids.direction_x);
	const Property* p_direction_y = properties_.GetProperty(ids.direction_y);
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_angle || !p_direction_to || !p_direction_x || !p_direction_y || !p_color_stop_list)
		return nullptr;

	using Corner = DecoratorLinearGradient::Corner;
	Corner corner = Corner::None;
	float angle = 0.f;

	if (p_direction_to->Get<bool>())
	{
		const Direction direction = (Direction)(p_direction_x->Get<int>() | p_direction_y->Get<int>());
		switch (direction)
		{
		case Direction::Top: angle = 0.f; break;
		case Direction::Right: angle = 0.5f * Math::RMLUI_PI; break;
		case Direction::Bottom: angle = Math::RMLUI_PI; break;
		case Direction::Left: angle = 1.5f * Math::RMLUI_PI; break;
		case Direction::TopLeft: corner = Corner::TopLeft; break;
		case Direction::TopRight: corner = Corner::TopRight; break;
		case Direction::BottomRight: corner = Corner::BottomRight; break;
		case Direction::BottomLeft: corner = Corner::BottomLeft; break;
		case Direction::None:
		default: return nullptr; break;
		}
	}
	else
	{
		angle = ComputeAngle(p_angle->GetNumericValue());
	}

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();
	const bool repeating = (name == "repeating-linear-gradient");

	auto decorator = MakeShared<DecoratorLinearGradient>();
	if (decorator->Initialise(repeating, corner, angle, color_stop_list))
		return decorator;

	return nullptr;
}